

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall
caffe::ExpParameter::MergePartialFromCodedStream(ExpParameter *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  float *pfVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  int iVar8;
  UnknownFieldSet *unknown_fields;
  char cVar9;
  uint tag;
  ulong uVar10;
  float local_3c;
  float local_38;
  float local_34;
  
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003af623;
      input->buffer_ = pbVar2 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003af623:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar10 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar6 | uVar10;
    }
    tag = (uint)uVar10;
    if ((uVar10 & 0x100000000) == 0) goto LAB_003af645;
    uVar7 = (uint)(uVar10 >> 3) & 0x1fffffff;
    cVar9 = (char)uVar10;
    if (uVar7 == 3) {
      if (cVar9 != '\x1d') goto LAB_003af645;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      pfVar4 = (float *)input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
        bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                          (input,(uint32 *)&local_34);
        if (!bVar5) goto LAB_003af799;
      }
      else {
        local_34 = *pfVar4;
        input->buffer_ = (uint8 *)(pfVar4 + 1);
      }
      this->shift_ = local_34;
LAB_003af67f:
      iVar8 = 0;
    }
    else if (uVar7 == 2) {
      if (cVar9 == '\x15') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        pfVar4 = (float *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
          bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)&local_38);
          if (!bVar5) goto LAB_003af799;
        }
        else {
          local_38 = *pfVar4;
          input->buffer_ = (uint8 *)(pfVar4 + 1);
        }
        this->scale_ = local_38;
        goto LAB_003af67f;
      }
LAB_003af645:
      iVar8 = 7;
      if ((tag & 7) != 4 && tag != 0) {
        pvVar3 = (this->_internal_metadata_).
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 .ptr_;
        if (((ulong)pvVar3 & 1) == 0) {
          unknown_fields =
               google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
        }
        else {
          unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
        }
        bVar5 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
        iVar8 = 6;
        if (bVar5) goto LAB_003af67f;
      }
    }
    else {
      if ((uVar7 != 1) || (cVar9 != '\r')) goto LAB_003af645;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      pfVar4 = (float *)input->buffer_;
      if (3 < *(int *)&input->buffer_end_ - (int)pfVar4) {
        local_3c = *pfVar4;
        input->buffer_ = (uint8 *)(pfVar4 + 1);
LAB_003af6cc:
        this->base_ = local_3c;
        goto LAB_003af67f;
      }
      bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                        (input,(uint32 *)&local_3c);
      if (bVar5) goto LAB_003af6cc;
LAB_003af799:
      iVar8 = 6;
    }
    if (iVar8 != 0) {
      return iVar8 != 6;
    }
  } while( true );
}

Assistant:

bool ExpParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.ExpParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional float base = 1 [default = -1];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(13u)) {
          set_has_base();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &base_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float scale = 2 [default = 1];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {
          set_has_scale();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &scale_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float shift = 3 [default = 0];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(29u)) {
          set_has_shift();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &shift_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.ExpParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.ExpParameter)
  return false;
#undef DO_
}